

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

void __thiscall
Js::CustomExternalWrapperObject::CustomExternalWrapperObject
          (CustomExternalWrapperObject *this,CustomExternalWrapperType *type,void *data,
          uint inlineSlotSize)

{
  void *dst;
  uint inlineSlotSize_local;
  void *data_local;
  CustomExternalWrapperType *type_local;
  CustomExternalWrapperObject *this_local;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,&type->super_DynamicType,false);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfe2a0;
  this->initialized = false;
  SlotInfo::SlotInfo((SlotInfo *)&(this->u).slot);
  if (inlineSlotSize == 0) {
    this->slotType = External;
    Memory::WriteBarrierPtr<void>::operator=(&(this->u).slot,data);
  }
  else {
    this->slotType = Inline;
    (this->u).inlineSlotSize = inlineSlotSize;
    if (data != (void *)0x0) {
      dst = GetInlineSlots(this);
      memcpy_s(dst,(ulong)inlineSlotSize,data,(ulong)inlineSlotSize);
    }
  }
  return;
}

Assistant:

CustomExternalWrapperObject::CustomExternalWrapperObject(CustomExternalWrapperType * type, void *data, uint inlineSlotSize) :
    Js::DynamicObject(type, false/* initSlots*/)
{
    if (inlineSlotSize != 0)
    {
        this->slotType = SlotType::Inline;
        this->u.inlineSlotSize = inlineSlotSize;
        if (data)
        {
            memcpy_s(this->GetInlineSlots(), inlineSlotSize, data, inlineSlotSize);
        }
    }
    else
    {
        this->slotType = SlotType::External;
        this->u.slot = data;
    }
}